

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params params,U64 pledgedSrcSize,U32 dictID
                 )

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  iVar4 = (((uint)(dictID != 0) - (uint)(dictID < 0x100)) + 2) - (uint)(dictID < 0x10000);
  iVar3 = 0;
  if (params.fParams.noDictIDFlag != 0) {
    iVar4 = 0;
  }
  bVar6 = params.fParams.contentSizeFlag != 0;
  bVar5 = pledgedSrcSize <= (ulong)(1L << ((byte)params.cParams.windowLog & 0x3f));
  if (params.fParams.contentSizeFlag != 0) {
    iVar3 = (uint)(0xfffffffe < pledgedSrcSize) +
            (((0xff < pledgedSrcSize) + 1) - (uint)(pledgedSrcSize < 0x10100));
  }
  if (dstCapacity < 0x12) {
    uVar1 = 0xffffffffffffffba;
  }
  else {
    if (params.format == ZSTD_f_zstd1) {
      *(undefined4 *)dst = 0xfd2fb528;
      uVar2 = 4;
    }
    else {
      uVar2 = 0;
    }
    *(byte *)((long)dst + uVar2) =
         (byte)(iVar3 << 6) | (char)iVar4 + (params.fParams.checksumFlag != 0) * '\x04' |
         (bVar6 && bVar5) << 5;
    uVar1 = uVar2 | 1;
    if (!bVar6 || !bVar5) {
      uVar1 = uVar2 | 2;
      *(byte *)((long)dst + (uVar2 | 1)) = (byte)params.cParams.windowLog * '\b' + -0x50;
    }
    if (iVar4 == 3) {
      *(U32 *)((long)dst + uVar1) = dictID;
      uVar1 = uVar1 + 4;
    }
    else if (iVar4 == 2) {
      *(short *)((long)dst + uVar1) = (short)dictID;
      uVar1 = uVar1 + 2;
    }
    else if (iVar4 == 1) {
      *(char *)((long)dst + uVar1) = (char)dictID;
      uVar1 = uVar1 + 1;
    }
    if (iVar3 == 1) {
      *(short *)((long)dst + uVar1) = (short)pledgedSrcSize + -0x100;
      uVar1 = uVar1 + 2;
    }
    else if (iVar3 == 2) {
      *(int *)((long)dst + uVar1) = (int)pledgedSrcSize;
      uVar1 = uVar1 + 4;
    }
    else if (iVar3 == 3) {
      *(U64 *)((long)dst + uVar1) = pledgedSrcSize;
      uVar1 = uVar1 + 8;
    }
    else if (bVar6 && bVar5) {
      *(char *)((long)dst + uVar1) = (char)pledgedSrcSize;
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params.fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params.fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params.cParams.windowLog;
    U32   const singleSegment = params.fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params.cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params.fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDecriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params.fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    if (dstCapacity < ZSTD_frameHeaderSize_max) return ERROR(dstSize_tooSmall);
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params.fParams.noDictIDFlag, dictID,  dictIDSizeCode);

    if (params.format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDecriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:  assert(0); /* impossible */
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:  assert(0); /* impossible */
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}